

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * register_functions(void *param_1)

{
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  void *local_10;
  void *param_0_local;
  
  local_10 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"resize",&local_31);
  skiwi::register_external_primitive
            (local_30,scm_resize,skiwi_void,skiwi_int64,skiwi_int64,
             "(resize w h) resizes the Game of Life grid to w x h cells.");
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"randomize",&local_69);
  skiwi::register_external_primitive
            (local_68,scm_randomize,skiwi_void,
             "(randomize) fills the Game of Life grid with random cells.");
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"clear",&local_91);
  skiwi::register_external_primitive
            (local_90,scm_clear,skiwi_void,"(clear) clears the Game of Life grid.");
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"next",&local_b9);
  skiwi::register_external_primitive
            (local_b8,scm_next,skiwi_void,
             "(next) shows the next generation of the Game of Life grid.");
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"run",&local_e1);
  skiwi::register_external_primitive
            (local_e0,scm_run,skiwi_void,"(run) starts the Game of Life simulation.");
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"stop",&local_109);
  skiwi::register_external_primitive
            (local_108,scm_stop,skiwi_void,"(stop) stops the Game of Life simulation.");
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"game-sleep",&local_131);
  skiwi::register_external_primitive
            (local_130,scm_game_sleep,skiwi_void,skiwi_int64,
             "(game-sleep <number>) waits <number> milliseconds between generations.");
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"set-cell",&local_159);
  skiwi::register_external_primitive
            (local_158,scm_set_cell,skiwi_void,skiwi_int64,skiwi_int64,
             "(set-cell <x> <y>) sets cell (x,y) on");
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"clear-cell",&local_181);
  skiwi::register_external_primitive
            (local_180,scm_clear_cell,skiwi_void,skiwi_int64,skiwi_int64,
             "(clear-cell <x> <y>) sets cell (x,y) off");
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"gun",&local_1a9);
  skiwi::register_external_primitive
            (local_1a8,scm_gun,skiwi_void,"(gun) generates the Gosper glider gun");
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"space-rake",&local_1d1);
  skiwi::register_external_primitive
            (local_1d0,scm_space_rake,skiwi_void,"(space-rake) generates the space-rake");
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"spaceship",&local_1f9);
  skiwi::register_external_primitive
            (local_1f8,scm_spaceship,skiwi_void,"(spaceship) generates the spaceship or glider");
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  return (void *)0x0;
}

Assistant:

void* register_functions(void*)
  {
  using namespace skiwi;
  register_external_primitive("resize", (void*)&scm_resize, skiwi_void, skiwi_int64, skiwi_int64, "(resize w h) resizes the Game of Life grid to w x h cells.");
  register_external_primitive("randomize", (void*)&scm_randomize, skiwi_void, "(randomize) fills the Game of Life grid with random cells.");
  register_external_primitive("clear", (void*)&scm_clear, skiwi_void, "(clear) clears the Game of Life grid.");
  register_external_primitive("next", (void*)&scm_next, skiwi_void, "(next) shows the next generation of the Game of Life grid.");
  register_external_primitive("run", (void*)&scm_run, skiwi_void, "(run) starts the Game of Life simulation.");
  register_external_primitive("stop", (void*)&scm_stop, skiwi_void, "(stop) stops the Game of Life simulation.");
  register_external_primitive("game-sleep", (void*)&scm_game_sleep, skiwi_void, skiwi_int64, "(game-sleep <number>) waits <number> milliseconds between generations.");
  register_external_primitive("set-cell", (void*)&scm_set_cell, skiwi_void, skiwi_int64, skiwi_int64, "(set-cell <x> <y>) sets cell (x,y) on");
  register_external_primitive("clear-cell", (void*)&scm_clear_cell, skiwi_void, skiwi_int64, skiwi_int64, "(clear-cell <x> <y>) sets cell (x,y) off");
  register_external_primitive("gun", (void*)&scm_gun, skiwi_void, "(gun) generates the Gosper glider gun");
  register_external_primitive("space-rake", (void*)&scm_space_rake, skiwi_void, "(space-rake) generates the space-rake");
  register_external_primitive("spaceship", (void*)&scm_spaceship, skiwi_void, "(spaceship) generates the spaceship or glider");
  return nullptr;
  }